

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O1

void __thiscall
CombinedH264Demuxer::CombinedH264Demuxer
          (CombinedH264Demuxer *this,BufferedReaderManager *readManager,char *streamName)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  AbstractReader *pAVar3;
  undefined4 *puVar4;
  ostringstream ss;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ostringstream local_198 [376];
  
  p_Var1 = &(this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractDemuxer).m_fileBlockSize = 0x200000;
  (this->super_AbstractDemuxer).m_timeOffset = 0;
  (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_CombinedH264Reader).m_tmpBuffer.m_data.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_CombinedH264Reader).m_tmpBuffer.m_size = 0;
  (this->super_CombinedH264Reader).m_state = Primary;
  (this->super_CombinedH264Reader).m_demuxedPID = 0;
  (this->super_CombinedH264Reader).m_firstDemuxCall = true;
  (this->super_CombinedH264Reader).m_mvcSPS = 0xffffffff;
  (this->super_CombinedH264Reader).m_mvcStreamIndex = -1;
  (this->super_CombinedH264Reader).m_avcStreamIndex = -1;
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer =
       (_func_int **)&PTR__CombinedH264Demuxer_002402a8;
  (this->super_CombinedH264Reader)._vptr_CombinedH264Reader =
       (_func_int **)&PTR__CombinedH264Demuxer_00240348;
  this->m_readManager = readManager;
  pAVar3 = BufferedReaderManager::getReader(readManager,streamName);
  this->m_bufferedReader = pAVar3;
  iVar2 = (*pAVar3->_vptr_AbstractReader[6])(pAVar3,0x80);
  this->m_readerID = iVar2;
  if (this->m_bufferedReader != (AbstractReader *)0x0) {
    this->m_lastReadRez = 0;
    this->m_dataProcessed = 0;
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "TS demuxer can\'t accept reader because this reader does not support BufferedReader interface"
             ,0x5c);
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 3;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1b8 == &local_1a8) {
    puVar4[6] = local_1a8;
    puVar4[7] = uStack_1a4;
    puVar4[8] = uStack_1a0;
    puVar4[9] = uStack_19c;
  }
  else {
    *(uint **)(puVar4 + 2) = local_1b8;
    *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1a4,local_1a8);
  }
  *(undefined8 *)(puVar4 + 4) = local_1b0;
  local_1a8 = local_1a8 & 0xffffff00;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

CombinedH264Demuxer::CombinedH264Demuxer(const BufferedReaderManager& readManager, const char* streamName)
    : m_readManager(readManager)
{
    m_bufferedReader = m_readManager.getReader(streamName);
    m_readerID = m_bufferedReader->createReader(MAX_TMP_BUFFER_SIZE);
    if (m_bufferedReader == nullptr)
        THROW(ERR_COMMON,
              "TS demuxer can't accept reader because this reader does not support BufferedReader interface")
    m_lastReadRez = 0;
    m_dataProcessed = 0;
}